

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLproxycode do_SOCKS4(Curl_cfilter *cf,socks_state *sx,Curl_easy *data)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  size_t hostnamelen;
  size_t packetsize;
  size_t plen;
  char buf [64];
  sockaddr_in *saddr_in;
  Curl_addrinfo *hp;
  Curl_dns_entry *dns;
  CURLproxycode presult;
  CURLcode result;
  uchar *socksreq;
  connectdata *pcStack_30;
  _Bool protocol4a;
  connectdata *conn;
  Curl_easy *data_local;
  socks_state *sx_local;
  Curl_cfilter *cf_local;
  
  pcStack_30 = cf->conn;
  socksreq._7_1_ = (pcStack_30->socks_proxy).proxytype == '\x06';
  _presult = sx->buffer;
  hp = (Curl_addrinfo *)0x0;
  conn = (connectdata *)data;
  data_local = (Curl_easy *)sx;
  sx_local = (socks_state *)cf;
  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    pcStack_30->ip_version = '\x01';
    if ((((((ulong)pcStack_30->bits & 1) != 0) && (data != (Curl_easy *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      pcVar4 = "";
      if ((bool)socksreq._7_1_) {
        pcVar4 = "a";
      }
      Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar4,sx->hostname,
                 (ulong)(uint)sx->remote_port);
    }
    if (((conn != (connectdata *)0x0) &&
        ((*(ulong *)&conn[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
       ((*(long *)(conn[3].secondary.remote_ip + 0xc) == 0 ||
        (0 < *(int *)(*(long *)(conn[3].secondary.remote_ip + 0xc) + 8))))) {
      Curl_infof((Curl_easy *)conn,"SOCKS4 communication to %s:%d",(data_local->set).seek_client,
                 (ulong)*(uint *)&(data_local->set).hsts_read);
    }
    *_presult = '\x04';
    _presult[1] = '\x01';
    _presult[2] = (uchar)((uint)*(undefined4 *)&(data_local->set).hsts_read >> 8);
    _presult[3] = (uchar)*(undefined4 *)&(data_local->set).hsts_read;
    if ((socksreq._7_1_ & 1) == 0) {
      dns._4_4_ = Curl_resolv((Curl_easy *)conn,(char *)(data_local->set).seek_client,
                              *(int *)&(data_local->set).hsts_read,
                              (uint)*(byte *)(*(long *)(sx_local->buffer + 8) + 0x5bb),true,
                              (Curl_dns_entry **)&hp);
      if (dns._4_4_ == CURLE_AGAIN) {
        socksstate((socks_state *)data_local,(Curl_easy *)conn,CONNECT_RESOLVING);
        if (((conn != (connectdata *)0x0) &&
            ((*(ulong *)&conn[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
           ((*(long *)(conn[3].secondary.remote_ip + 0xc) == 0 ||
            (0 < *(int *)(*(long *)(conn[3].secondary.remote_ip + 0xc) + 8))))) {
          Curl_infof((Curl_easy *)conn,"SOCKS4 non-blocking resolve of %s",
                     (data_local->set).seek_client);
        }
        return CURLPX_OK;
      }
      if (dns._4_4_ != CURLE_OK) {
        return CURLPX_RESOLVE_HOST;
      }
      socksstate((socks_state *)data_local,(Curl_easy *)conn,CONNECT_RESOLVED);
      goto LAB_0018ee87;
    }
    socksstate((socks_state *)data_local,(Curl_easy *)conn,CONNECT_REQ_INIT);
    goto LAB_0018effe;
  default:
    goto LAB_0018f25f;
  case CONNECT_SOCKS_READ:
    goto switchD_0018ebf6_caseD_4;
  case CONNECT_REQ_INIT:
    goto switchD_0018ebf6_caseD_9;
  case CONNECT_RESOLVING:
    dns._4_4_ = Curl_resolv_check(data,(Curl_dns_entry **)&hp);
    if (hp == (Curl_addrinfo *)0x0) {
      if (dns._4_4_ != CURLE_OK) {
        return CURLPX_RESOLVE_HOST;
      }
      return CURLPX_OK;
    }
switchD_0018ebf6_caseD_b:
LAB_0018ee87:
    saddr_in = (sockaddr_in *)0x0;
    if (hp == (Curl_addrinfo *)0x0) {
      Curl_failf((Curl_easy *)conn,"Failed to resolve \"%s\" for SOCKS4 connect.",
                 (data_local->set).seek_client);
    }
    else {
      saddr_in = *(sockaddr_in **)hp;
      while( true ) {
        bVar5 = false;
        if (saddr_in != (sockaddr_in *)0x0) {
          bVar5 = (saddr_in->sin_addr).s_addr != 2;
        }
        if (!bVar5) break;
        saddr_in = *(sockaddr_in **)saddr_in[2].sin_zero;
      }
      if (saddr_in == (sockaddr_in *)0x0) {
        Curl_failf((Curl_easy *)conn,"SOCKS4 connection to %s not supported",
                   (data_local->set).seek_client);
      }
      else {
        Curl_printable_address((Curl_addrinfo *)saddr_in,(char *)&plen,0x40);
        lVar1 = *(long *)(saddr_in + 2);
        _presult[4] = *(uchar *)(lVar1 + 4);
        _presult[5] = *(uchar *)(lVar1 + 5);
        _presult[6] = *(uchar *)(lVar1 + 6);
        _presult[7] = *(uchar *)(lVar1 + 7);
        if (((conn != (connectdata *)0x0) &&
            ((*(ulong *)&conn[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
           ((*(long *)(conn[3].secondary.remote_ip + 0xc) == 0 ||
            (0 < *(int *)(*(long *)(conn[3].secondary.remote_ip + 0xc) + 8))))) {
          Curl_infof((Curl_easy *)conn,"SOCKS4 connect to IPv4 %s (locally resolved)",&plen);
        }
        Curl_resolv_unlink((Curl_easy *)conn,(Curl_dns_entry **)&hp);
      }
    }
    if (saddr_in == (sockaddr_in *)0x0) {
      cf_local._4_4_ = CURLPX_RESOLVE_HOST;
    }
    else {
switchD_0018ebf6_caseD_9:
LAB_0018effe:
      _presult[8] = '\0';
      if ((data_local->set).hsts_read_userp != (void *)0x0) {
        sVar2 = strlen((char *)(data_local->set).hsts_read_userp);
        if (0xff < sVar2) {
          Curl_failf((Curl_easy *)conn,"Too long SOCKS proxy username");
          return CURLPX_LONG_USER;
        }
        memcpy(_presult + 8,(data_local->set).hsts_read_userp,sVar2 + 1);
      }
      sVar2 = strlen((char *)(_presult + 8));
      hostnamelen = sVar2 + 9;
      if ((socksreq._7_1_ & 1) != 0) {
        _presult[4] = '\0';
        _presult[5] = '\0';
        _presult[6] = '\0';
        _presult[7] = '\x01';
        sVar2 = strlen((char *)(data_local->set).seek_client);
        uVar3 = sVar2 + 1;
        if ((0xff < uVar3) || (599 < hostnamelen + uVar3)) {
          Curl_failf((Curl_easy *)conn,"SOCKS4: too long hostname");
          return CURLPX_LONG_HOSTNAME;
        }
        strcpy((char *)(_presult + hostnamelen),(char *)(data_local->set).seek_client);
        hostnamelen = uVar3 + hostnamelen;
      }
      (data_local->set).prereq_userp = _presult;
      data_local->id = hostnamelen;
      socksstate((socks_state *)data_local,(Curl_easy *)conn,CONNECT_REQ_SENDING);
switchD_0018ebf6_caseD_e:
      dns._0_4_ = socks_state_send((Curl_cfilter *)sx_local,(socks_state *)data_local,
                                   (Curl_easy *)conn,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
      cf_local._4_4_ = (CURLproxycode)dns;
      if ((CURLproxycode)dns == CURLPX_OK) {
        if (data_local->id == 0) {
          data_local->id = 8;
          (data_local->set).prereq_userp = _presult;
          socksstate((socks_state *)data_local,(Curl_easy *)conn,CONNECT_SOCKS_READ);
switchD_0018ebf6_caseD_4:
          dns._0_4_ = socks_state_recv((Curl_cfilter *)sx_local,(socks_state *)data_local,
                                       (Curl_easy *)conn,CURLPX_RECV_CONNECT,"connect request ack");
          cf_local._4_4_ = (CURLproxycode)dns;
          if ((CURLproxycode)dns == CURLPX_OK) {
            if (data_local->id == 0) {
              socksstate((socks_state *)data_local,(Curl_easy *)conn,CONNECT_DONE);
LAB_0018f25f:
              if (*_presult == '\0') {
                switch(_presult[1]) {
                case 'Z':
                  if (((conn != (connectdata *)0x0) &&
                      ((*(ulong *)&conn[1].proxyntlm.target_info_len >> 0x1e & 1) != 0)) &&
                     ((*(long *)(conn[3].secondary.remote_ip + 0xc) == 0 ||
                      (0 < *(int *)(*(long *)(conn[3].secondary.remote_ip + 0xc) + 8))))) {
                    pcVar4 = "";
                    if ((socksreq._7_1_ & 1) != 0) {
                      pcVar4 = "a";
                    }
                    Curl_infof((Curl_easy *)conn,"SOCKS4%s request granted.",pcVar4);
                  }
                  cf_local._4_4_ = CURLPX_OK;
                  break;
                case '[':
                  Curl_failf((Curl_easy *)conn,
                             "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                             ,(ulong)_presult[4],(ulong)_presult[5],(ulong)_presult[6],
                             (ulong)_presult[7],(uint)CONCAT11(_presult[2],_presult[3]),
                             (uint)_presult[1]);
                  cf_local._4_4_ = CURLPX_REQUEST_FAILED;
                  break;
                case '\\':
                  Curl_failf((Curl_easy *)conn,
                             "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                             ,(ulong)_presult[4],(ulong)_presult[5],(ulong)_presult[6],
                             (ulong)_presult[7],(uint)CONCAT11(_presult[2],_presult[3]),
                             (uint)_presult[1]);
                  cf_local._4_4_ = CURLPX_IDENTD;
                  break;
                case ']':
                  Curl_failf((Curl_easy *)conn,
                             "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                             ,(ulong)_presult[4],(ulong)_presult[5],(ulong)_presult[6],
                             (ulong)_presult[7],(uint)CONCAT11(_presult[2],_presult[3]),
                             (uint)_presult[1]);
                  cf_local._4_4_ = CURLPX_IDENTD_DIFFER;
                  break;
                default:
                  Curl_failf((Curl_easy *)conn,
                             "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                             (ulong)_presult[4],(ulong)_presult[5],(ulong)_presult[6],
                             (ulong)_presult[7],(uint)CONCAT11(_presult[2],_presult[3]),
                             (uint)_presult[1]);
                  cf_local._4_4_ = CURLPX_UNKNOWN_FAIL;
                }
              }
              else {
                Curl_failf((Curl_easy *)conn,"SOCKS4 reply has wrong version, version should be 0.")
                ;
                cf_local._4_4_ = CURLPX_BAD_VERSION;
              }
            }
            else {
              cf_local._4_4_ = CURLPX_OK;
            }
          }
        }
        else {
          cf_local._4_4_ = CURLPX_OK;
        }
      }
    }
    break;
  case CONNECT_RESOLVED:
    goto switchD_0018ebf6_caseD_b;
  case CONNECT_REQ_SENDING:
    goto switchD_0018ebf6_caseD_e;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLproxycode do_SOCKS4(struct Curl_cfilter *cf,
                               struct socks_state *sx,
                               struct Curl_easy *data)
{
  struct connectdata *conn = cf->conn;
  const bool protocol4a =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS4A);
  unsigned char *socksreq = sx->buffer;
  CURLcode result;
  CURLproxycode presult;
  struct Curl_dns_entry *dns = NULL;

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    /* SOCKS4 can only do IPv4, insist! */
    conn->ip_version = CURL_IPRESOLVE_V4;
    if(conn->bits.httpproxy)
      infof(data, "SOCKS4%s: connecting to HTTP proxy %s port %d",
            protocol4a ? "a" : "", sx->hostname, sx->remote_port);

    infof(data, "SOCKS4 communication to %s:%d",
          sx->hostname, sx->remote_port);

    /*
     * Compose socks4 request
     *
     * Request format
     *
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     * # of bytes:  1    1      2              4           variable       1
     */

    socksreq[0] = 4; /* version (SOCKS4) */
    socksreq[1] = 1; /* connect */
    socksreq[2] = (unsigned char)((sx->remote_port >> 8) & 0xff); /* MSB */
    socksreq[3] = (unsigned char)(sx->remote_port & 0xff);        /* LSB */

    /* DNS resolve only for SOCKS4, not SOCKS4a */
    if(!protocol4a) {
      result = Curl_resolv(data, sx->hostname, sx->remote_port,
                           cf->conn->ip_version, TRUE, &dns);

      if(result == CURLE_AGAIN) {
        sxstate(sx, data, CONNECT_RESOLVING);
        infof(data, "SOCKS4 non-blocking resolve of %s", sx->hostname);
        return CURLPX_OK;
      }
      else if(result)
        return CURLPX_RESOLVE_HOST;
      sxstate(sx, data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }

    /* socks4a does not resolve anything locally */
    sxstate(sx, data, CONNECT_REQ_INIT);
    goto CONNECT_REQ_INIT;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    result = Curl_resolv_check(data, &dns);
    if(!dns) {
      if(result)
        return CURLPX_RESOLVE_HOST;
      return CURLPX_OK;
    }
    FALLTHROUGH();
  case CONNECT_RESOLVED:
CONNECT_RESOLVED:
  {
    struct Curl_addrinfo *hp = NULL;
    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns. It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns) {
      hp = dns->addr;

      /* scan for the first IPv4 address */
      while(hp && (hp->ai_family != AF_INET))
        hp = hp->ai_next;

      if(hp) {
        struct sockaddr_in *saddr_in;
        char buf[64];
        Curl_printable_address(hp, buf, sizeof(buf));

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        socksreq[4] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[0];
        socksreq[5] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[1];
        socksreq[6] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[2];
        socksreq[7] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[3];

        infof(data, "SOCKS4 connect to IPv4 %s (locally resolved)", buf);

        Curl_resolv_unlink(data, &dns); /* not used anymore from now on */
      }
      else
        failf(data, "SOCKS4 connection to %s not supported", sx->hostname);
    }
    else
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            sx->hostname);

    if(!hp)
      return CURLPX_RESOLVE_HOST;
  }
    FALLTHROUGH();
  case CONNECT_REQ_INIT:
CONNECT_REQ_INIT:
    /*
     * This is currently not supporting "Identification Protocol (RFC1413)".
     */
    socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
    if(sx->proxy_user) {
      size_t plen = strlen(sx->proxy_user);
      if(plen > 255) {
        /* there is no real size limit to this field in the protocol, but
           SOCKS5 limits the proxy user field to 255 bytes and it seems likely
           that a longer field is either a mistake or malicious input */
        failf(data, "Too long SOCKS proxy username");
        return CURLPX_LONG_USER;
      }
      /* copy the proxy name WITH trailing zero */
      memcpy(socksreq + 8, sx->proxy_user, plen + 1);
    }

    /*
     * Make connection
     */
    {
      size_t packetsize = 9 +
        strlen((char *)socksreq + 8); /* size including NUL */

      /* If SOCKS4a, set special invalid IP address 0.0.0.x */
      if(protocol4a) {
        size_t hostnamelen = 0;
        socksreq[4] = 0;
        socksreq[5] = 0;
        socksreq[6] = 0;
        socksreq[7] = 1;
        /* append hostname */
        hostnamelen = strlen(sx->hostname) + 1; /* length including NUL */
        if((hostnamelen <= 255) &&
           (packetsize + hostnamelen < sizeof(sx->buffer)))
          strcpy((char *)socksreq + packetsize, sx->hostname);
        else {
          failf(data, "SOCKS4: too long hostname");
          return CURLPX_LONG_HOSTNAME;
        }
        packetsize += hostnamelen;
      }
      sx->outp = socksreq;
      DEBUGASSERT(packetsize <= sizeof(sx->buffer));
      sx->outstanding = packetsize;
      sxstate(sx, data, CONNECT_REQ_SENDING);
    }
    FALLTHROUGH();
  case CONNECT_REQ_SENDING:
    /* Send request */
    presult = socks_state_send(cf, sx, data, CURLPX_SEND_CONNECT,
                               "SOCKS4 connect request");
    if(CURLPX_OK != presult)
      return presult;
    else if(sx->outstanding) {
      /* remain in sending state */
      return CURLPX_OK;
    }
    /* done sending! */
    sx->outstanding = 8; /* receive data size */
    sx->outp = socksreq;
    sxstate(sx, data, CONNECT_SOCKS_READ);

    FALLTHROUGH();
  case CONNECT_SOCKS_READ:
    /* Receive response */
    presult = socks_state_recv(cf, sx, data, CURLPX_RECV_CONNECT,
                               "connect request ack");
    if(CURLPX_OK != presult)
      return presult;
    else if(sx->outstanding) {
      /* remain in reading state */
      return CURLPX_OK;
    }
    sxstate(sx, data, CONNECT_DONE);
    break;
  default: /* lots of unused states in SOCKS4 */
    break;
  }

  /*
   * Response format
   *
   *     +----+----+----+----+----+----+----+----+
   *     | VN | CD | DSTPORT |      DSTIP        |
   *     +----+----+----+----+----+----+----+----+
   * # of bytes:  1    1      2              4
   *
   * VN is the version of the reply code and should be 0. CD is the result
   * code with one of the following values:
   *
   * 90: request granted
   * 91: request rejected or failed
   * 92: request rejected because SOCKS server cannot connect to
   *     identd on the client
   * 93: request rejected because the client program and identd
   *     report different user-ids
   */

  /* wrong version ? */
  if(socksreq[0]) {
    failf(data,
          "SOCKS4 reply has wrong version, version should be 0.");
    return CURLPX_BAD_VERSION;
  }

  /* Result */
  switch(socksreq[1]) {
  case 90:
    infof(data, "SOCKS4%s request granted.", protocol4a ? "a" : "");
    break;
  case 91:
    failf(data,
          "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected or failed.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_REQUEST_FAILED;
  case 92:
    failf(data,
          "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because SOCKS server cannot connect to "
          "identd on the client.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD;
  case 93:
    failf(data,
          "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because the client program and identd "
          "report different user-ids.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD_DIFFER;
  default:
    failf(data,
          "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", Unknown.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_UNKNOWN_FAIL;
  }

  return CURLPX_OK; /* Proxy was successful! */
}